

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O2

int MAFSA_automaton_val_to_int_pair(MAFSA_letter *l,size_t sz_l,MAFSA_letter delim,int *out)

{
  undefined3 in_register_00000011;
  uint uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar2 = sz_l & 0xffffffff;
  uVar1 = (int)sz_l - 2;
  iVar3 = 0;
  while( true ) {
    uVar2 = uVar2 - 1;
    if ((int)(uint)uVar2 < 0) {
      return -1;
    }
    if (l[(uint)uVar2 & 0x7fffffff] == delim) break;
    iVar3 = iVar3 * CONCAT31(in_register_00000011,delim) + (uint)l[(uint)uVar2 & 0x7fffffff];
    uVar1 = uVar1 - 1;
  }
  out[1] = iVar3;
  iVar3 = 0;
  for (; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    iVar3 = iVar3 * CONCAT31(in_register_00000011,delim) + (uint)l[uVar1];
  }
  *out = iVar3;
  return 0;
}

Assistant:

extern int MAFSA_automaton_val_to_int_pair(const MAFSA_letter *l,
    size_t sz_l, MAFSA_letter delim, int *out)
{
    int i;
    int count;
    int valid = 0;

    for (i = sz_l - 1, count = 0; i >= 0; --i)
    {
        if (delim == l[i])
        {
            valid = 1;
            break;
        }

        count *= delim;
        count += l[i];
    }

    if (0 == valid)
    {
        return -1;
    }

    out[1] = count;

    for (--i, count = 0; i >= 0; --i)
    {
        count *= delim;
        count += l[i];
    }

    out[0] = count;

    return 0;
}